

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O0

int32_t __thiscall icu_63::RegexCompile::allocateData(RegexCompile *this,int32_t size)

{
  UBool UVar1;
  int32_t dataIndex;
  int32_t size_local;
  RegexCompile *this_local;
  
  UVar1 = ::U_FAILURE(*this->fStatus);
  if (UVar1 == '\0') {
    if (((size < 1) || (0x100 < size)) || (this->fRXPat->fDataSize < 0)) {
      error(this,U_REGEX_ERROR_START);
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = this->fRXPat->fDataSize;
      this->fRXPat->fDataSize = size + this->fRXPat->fDataSize;
      if (0xffffef < this->fRXPat->fDataSize) {
        error(this,U_REGEX_ERROR_START);
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t RegexCompile::allocateData(int32_t size) {
    if (U_FAILURE(*fStatus)) {
        return 0;
    }
    if (size <= 0 || size > 0x100 || fRXPat->fDataSize < 0) {
        error(U_REGEX_INTERNAL_ERROR);
        return 0;
    }
    int32_t dataIndex = fRXPat->fDataSize;
    fRXPat->fDataSize += size;
    if (fRXPat->fDataSize >= 0x00fffff0) {
        error(U_REGEX_INTERNAL_ERROR);
    }
    return dataIndex;
}